

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_utils.h
# Opt level: O0

int sunvsnprintf(char *buffer,size_t bufsz,char *format,__va_list_tag *vlist)

{
  int iVar1;
  undefined8 *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  va_list tmp;
  int size;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_24;
  
  local_24 = 0;
  local_38 = in_RCX[2];
  local_48 = *in_RCX;
  uStack_40 = in_RCX[1];
  iVar1 = vsnprintf(in_RDI,in_RSI,in_RDX,&local_48);
  return iVar1;
}

Assistant:

static inline int sunvsnprintf(char* buffer, size_t bufsz, const char* format,
                               va_list vlist)
{
  int size = 0;
  va_list tmp;
  va_copy(tmp, vlist);
  size = vsnprintf(buffer, bufsz, format, tmp);
  va_end(tmp);
  return size;
}